

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Global * __thiscall wasm::Module::addGlobal(Module *this,Global *curr)

{
  Global *pGVar1;
  allocator<char> local_39;
  string local_38;
  Global *local_18;
  Global *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (Global *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"addGlobal",&local_39);
  pGVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>,std::unordered_map<wasm::Name,wasm::Global*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Global*>>>,wasm::Global>
                     (&this->globals,&this->globalsMap,curr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return pGVar1;
}

Assistant:

Global* Module::addGlobal(Global* curr) {
  return addModuleElement(globals, globalsMap, curr, "addGlobal");
}